

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jfdctint.c
# Opt level: O0

void jpeg_fdct_10x5(DCTELEM *data,JSAMPARRAY sample_data,JDIMENSION start_col)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  byte *pbVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  uint in_EDX;
  long in_RSI;
  int *in_RDI;
  int ctr;
  JSAMPROW elemptr;
  DCTELEM *dataptr;
  INT32 tmp14;
  INT32 tmp13;
  INT32 tmp12;
  INT32 tmp11;
  INT32 tmp10;
  INT32 tmp4;
  INT32 tmp3;
  INT32 tmp2;
  INT32 tmp1;
  INT32 tmp0;
  int local_7c;
  int *local_70;
  
  memset(in_RDI + 0x28,0,0x60);
  local_70 = in_RDI;
  for (local_7c = 0; local_7c < 5; local_7c = local_7c + 1) {
    pbVar5 = (byte *)(*(long *)(in_RSI + (long)local_7c * 8) + (ulong)in_EDX);
    iVar3 = (uint)pbVar5[2] + (uint)pbVar5[7];
    lVar6 = (long)(int)((uint)*pbVar5 + (uint)pbVar5[9]) +
            (long)(int)((uint)pbVar5[4] + (uint)pbVar5[5]);
    lVar7 = (long)(int)((uint)*pbVar5 + (uint)pbVar5[9]) -
            (long)(int)((uint)pbVar5[4] + (uint)pbVar5[5]);
    lVar8 = (long)(int)((uint)pbVar5[1] + (uint)pbVar5[8]) +
            (long)(int)((uint)pbVar5[3] + (uint)pbVar5[6]);
    lVar9 = (long)(int)((uint)pbVar5[1] + (uint)pbVar5[8]) -
            (long)(int)((uint)pbVar5[3] + (uint)pbVar5[6]);
    lVar10 = (long)(int)((uint)*pbVar5 - (uint)pbVar5[9]);
    lVar11 = (long)(int)((uint)pbVar5[1] - (uint)pbVar5[8]);
    iVar4 = (uint)pbVar5[2] - (uint)pbVar5[7];
    lVar12 = (long)(int)((uint)pbVar5[3] - (uint)pbVar5[6]);
    lVar13 = (long)(int)((uint)pbVar5[4] - (uint)pbVar5[5]);
    *local_70 = ((int)lVar6 + (int)lVar8 + iVar3 + -0x500) * 4;
    local_70[4] = (int)((lVar6 + (long)iVar3 * -2) * 0x249d + (lVar8 + (long)iVar3 * -2) * -0xdfc +
                        0x400 >> 0xb);
    lVar6 = (lVar7 + lVar9) * 0x1a9a;
    local_70[2] = (int)(lVar6 + lVar7 * 0x1071 + 0x400 >> 0xb);
    local_70[6] = (int)(lVar6 + lVar9 * -0x45a4 + 0x400 >> 0xb);
    lVar6 = lVar11 - lVar12;
    local_70[5] = (((int)(lVar10 + lVar13) - (int)lVar6) - iVar4) * 4;
    local_70[1] = (int)(lVar10 * 0x2cb3 + lVar11 * 0x2853 + (long)iVar4 * 0x2000 + lVar12 * 0x148c +
                        lVar13 * 0x714 + 0x400 >> 0xb);
    lVar7 = (lVar10 - lVar13) * 0x1e6f + (lVar11 + lVar12) * -0x12cf;
    lVar6 = (lVar10 + lVar13 + lVar6) * 0x9e3 + lVar6 * 0x1000 + (long)iVar4 * -0x2000;
    local_70[3] = (int)(lVar7 + lVar6 + 0x400 >> 0xb);
    local_70[7] = (int)((lVar7 - lVar6) + 0x400 >> 0xb);
    local_70 = local_70 + 8;
  }
  local_70 = in_RDI;
  for (local_7c = 7; -1 < local_7c; local_7c = local_7c + -1) {
    iVar3 = *local_70;
    lVar7 = (long)(iVar3 + local_70[0x20]) + (long)(local_70[8] + local_70[0x18]);
    iVar4 = *local_70;
    iVar1 = local_70[0x20];
    iVar2 = local_70[8];
    *local_70 = (int)((lVar7 + local_70[0x10]) * 0x28f6 + 0x4000 >> 0xf);
    lVar6 = ((long)(iVar3 + local_70[0x20]) - (long)(local_70[8] + local_70[0x18])) * 0x2062;
    lVar7 = lVar7 + (long)local_70[0x10] * -4;
    local_70[0x10] = (int)(lVar6 + lVar7 * 0xe7b + 0x4000 >> 0xf);
    local_70[0x20] = (int)(lVar6 + lVar7 * -0xe7b + 0x4000 >> 0xf);
    lVar6 = ((long)(iVar4 - iVar1) + (long)(iVar2 - local_70[0x18])) * 0x220c;
    local_70[8] = (int)(lVar6 + (long)(iVar4 - iVar1) * 0x150b + 0x4000 >> 0xf);
    local_70[0x18] = (int)(lVar6 + (long)(iVar2 - local_70[0x18]) * -0x5924 + 0x4000 >> 0xf);
    local_70 = local_70 + 1;
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_fdct_10x5 (DCTELEM * data, JSAMPARRAY sample_data, JDIMENSION start_col)
{
  INT32 tmp0, tmp1, tmp2, tmp3, tmp4;
  INT32 tmp10, tmp11, tmp12, tmp13, tmp14;
  DCTELEM *dataptr;
  JSAMPROW elemptr;
  int ctr;
  SHIFT_TEMPS

  /* Zero 3 bottom rows of output coefficient block. */
  MEMZERO(&data[DCTSIZE*5], SIZEOF(DCTELEM) * DCTSIZE * 3);

  /* Pass 1: process rows. */
  /* Note results are scaled up by sqrt(8) compared to a true DCT; */
  /* furthermore, we scale the results by 2**PASS1_BITS. */
  /* 10-point FDCT kernel, cK represents sqrt(2) * cos(K*pi/20). */

  dataptr = data;
  for (ctr = 0; ctr < 5; ctr++) {
    elemptr = sample_data[ctr] + start_col;

    /* Even part */

    tmp0 = GETJSAMPLE(elemptr[0]) + GETJSAMPLE(elemptr[9]);
    tmp1 = GETJSAMPLE(elemptr[1]) + GETJSAMPLE(elemptr[8]);
    tmp12 = GETJSAMPLE(elemptr[2]) + GETJSAMPLE(elemptr[7]);
    tmp3 = GETJSAMPLE(elemptr[3]) + GETJSAMPLE(elemptr[6]);
    tmp4 = GETJSAMPLE(elemptr[4]) + GETJSAMPLE(elemptr[5]);

    tmp10 = tmp0 + tmp4;
    tmp13 = tmp0 - tmp4;
    tmp11 = tmp1 + tmp3;
    tmp14 = tmp1 - tmp3;

    tmp0 = GETJSAMPLE(elemptr[0]) - GETJSAMPLE(elemptr[9]);
    tmp1 = GETJSAMPLE(elemptr[1]) - GETJSAMPLE(elemptr[8]);
    tmp2 = GETJSAMPLE(elemptr[2]) - GETJSAMPLE(elemptr[7]);
    tmp3 = GETJSAMPLE(elemptr[3]) - GETJSAMPLE(elemptr[6]);
    tmp4 = GETJSAMPLE(elemptr[4]) - GETJSAMPLE(elemptr[5]);

    /* Apply unsigned->signed conversion */
    dataptr[0] = (DCTELEM)
      ((tmp10 + tmp11 + tmp12 - 10 * CENTERJSAMPLE) << PASS1_BITS);
    tmp12 += tmp12;
    dataptr[4] = (DCTELEM)
      DESCALE(MULTIPLY(tmp10 - tmp12, FIX(1.144122806)) - /* c4 */
	      MULTIPLY(tmp11 - tmp12, FIX(0.437016024)),  /* c8 */
	      CONST_BITS-PASS1_BITS);
    tmp10 = MULTIPLY(tmp13 + tmp14, FIX(0.831253876));    /* c6 */
    dataptr[2] = (DCTELEM)
      DESCALE(tmp10 + MULTIPLY(tmp13, FIX(0.513743148)),  /* c2-c6 */
	      CONST_BITS-PASS1_BITS);
    dataptr[6] = (DCTELEM)
      DESCALE(tmp10 - MULTIPLY(tmp14, FIX(2.176250899)),  /* c2+c6 */
	      CONST_BITS-PASS1_BITS);

    /* Odd part */

    tmp10 = tmp0 + tmp4;
    tmp11 = tmp1 - tmp3;
    dataptr[5] = (DCTELEM) ((tmp10 - tmp11 - tmp2) << PASS1_BITS);
    tmp2 <<= CONST_BITS;
    dataptr[1] = (DCTELEM)
      DESCALE(MULTIPLY(tmp0, FIX(1.396802247)) +          /* c1 */
	      MULTIPLY(tmp1, FIX(1.260073511)) + tmp2 +   /* c3 */
	      MULTIPLY(tmp3, FIX(0.642039522)) +          /* c7 */
	      MULTIPLY(tmp4, FIX(0.221231742)),           /* c9 */
	      CONST_BITS-PASS1_BITS);
    tmp12 = MULTIPLY(tmp0 - tmp4, FIX(0.951056516)) -     /* (c3+c7)/2 */
	    MULTIPLY(tmp1 + tmp3, FIX(0.587785252));      /* (c1-c9)/2 */
    tmp13 = MULTIPLY(tmp10 + tmp11, FIX(0.309016994)) +   /* (c3-c7)/2 */
	    (tmp11 << (CONST_BITS - 1)) - tmp2;
    dataptr[3] = (DCTELEM) DESCALE(tmp12 + tmp13, CONST_BITS-PASS1_BITS);
    dataptr[7] = (DCTELEM) DESCALE(tmp12 - tmp13, CONST_BITS-PASS1_BITS);

    dataptr += DCTSIZE;		/* advance pointer to next row */
  }

  /* Pass 2: process columns.
   * We remove the PASS1_BITS scaling, but leave the results scaled up
   * by an overall factor of 8.
   * We must also scale the output by (8/10)*(8/5) = 32/25, which we
   * fold into the constant multipliers:
   * 5-point FDCT kernel, cK represents sqrt(2) * cos(K*pi/10) * 32/25.
   */

  dataptr = data;
  for (ctr = DCTSIZE-1; ctr >= 0; ctr--) {
    /* Even part */

    tmp0 = dataptr[DCTSIZE*0] + dataptr[DCTSIZE*4];
    tmp1 = dataptr[DCTSIZE*1] + dataptr[DCTSIZE*3];
    tmp2 = dataptr[DCTSIZE*2];

    tmp10 = tmp0 + tmp1;
    tmp11 = tmp0 - tmp1;

    tmp0 = dataptr[DCTSIZE*0] - dataptr[DCTSIZE*4];
    tmp1 = dataptr[DCTSIZE*1] - dataptr[DCTSIZE*3];

    dataptr[DCTSIZE*0] = (DCTELEM)
      DESCALE(MULTIPLY(tmp10 + tmp2, FIX(1.28)),        /* 32/25 */
	      CONST_BITS+PASS1_BITS);
    tmp11 = MULTIPLY(tmp11, FIX(1.011928851));          /* (c2+c4)/2 */
    tmp10 -= tmp2 << 2;
    tmp10 = MULTIPLY(tmp10, FIX(0.452548340));          /* (c2-c4)/2 */
    dataptr[DCTSIZE*2] = (DCTELEM) DESCALE(tmp11 + tmp10, CONST_BITS+PASS1_BITS);
    dataptr[DCTSIZE*4] = (DCTELEM) DESCALE(tmp11 - tmp10, CONST_BITS+PASS1_BITS);

    /* Odd part */

    tmp10 = MULTIPLY(tmp0 + tmp1, FIX(1.064004961));    /* c3 */

    dataptr[DCTSIZE*1] = (DCTELEM)
      DESCALE(tmp10 + MULTIPLY(tmp0, FIX(0.657591230)), /* c1-c3 */
	      CONST_BITS+PASS1_BITS);
    dataptr[DCTSIZE*3] = (DCTELEM)
      DESCALE(tmp10 - MULTIPLY(tmp1, FIX(2.785601151)), /* c1+c3 */
	      CONST_BITS+PASS1_BITS);

    dataptr++;			/* advance pointer to next column */
  }
}